

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::NegativeLinkErrors::Run(NegativeLinkErrors *this)

{
  bool bVar1;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  NegativeLinkErrors *local_18;
  NegativeLinkErrors *this_local;
  
  local_18 = this;
  bVar1 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(rgba32f) uniform image1D g_image;\nvoid main() {\n  imageStore(g_image, gl_VertexID, vec4(0));\n  gl_Position = i_position;\n}"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) uniform image2D g_image;\nvoid main() {\n  imageStore(g_image, ivec2(gl_FragCoord), vec4(1.0));\n  o_color = vec4(1.0);\n}"
               ,&local_71);
    bVar1 = Link(this,&local_38,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,
                 "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(rgba32f) uniform image1D g_image;\nvoid main() {\n  imageStore(g_image, gl_VertexID, vec4(0));\n  gl_Position = i_position;\n}"
                 ,&local_99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rg32f) uniform image1D g_image;\nvoid main() {\n  imageStore(g_image, int(gl_FragCoord.x), vec4(1.0));\n  o_color = vec4(1.0);\n}"
                 ,&local_c1);
      bVar1 = Link(this,&local_98,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        this_local = (NegativeLinkErrors *)0x0;
      }
      else {
        this_local = (NegativeLinkErrors *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (NegativeLinkErrors *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (NegativeLinkErrors *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		if (!Link("#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
				  "layout(rgba32f) uniform image1D g_image;" NL "void main() {" NL
				  "  imageStore(g_image, gl_VertexID, vec4(0));" NL "  gl_Position = i_position;" NL "}",
				  "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
				  "layout(rgba32f) uniform image2D g_image;" NL "void main() {" NL
				  "  imageStore(g_image, ivec2(gl_FragCoord), vec4(1.0));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Link("#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
				  "layout(rgba32f) uniform image1D g_image;" NL "void main() {" NL
				  "  imageStore(g_image, gl_VertexID, vec4(0));" NL "  gl_Position = i_position;" NL "}",
				  "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
				  "layout(rg32f) uniform image1D g_image;" NL "void main() {" NL
				  "  imageStore(g_image, int(gl_FragCoord.x), vec4(1.0));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		return NO_ERROR;
	}